

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O3

void __thiscall webfront::log::info<>(log *this,string_view fmt)

{
  pointer pfVar1;
  _Alloc_hider _Var2;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *s;
  pointer pfVar3;
  string_view fmt_00;
  char local_71;
  string local_70;
  size_type local_50;
  pointer local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = (char *)fmt._M_len;
  if (logTypeEnabled._3_1_ == '\x01') {
    local_71 = 'I';
    local_38._M_len = (size_t)this;
    local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    fmt_00._M_str = "[{}] {:%T} | {}";
    fmt_00._M_len = 0xf;
    std::
    format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::basic_string_view<char,std::char_traits<char>>&>
              (&local_70,fmt_00,&local_71,&local_40,&local_38);
    _Var2._M_p = local_70._M_dataplus._M_p;
    pfVar1 = Sinks::sinks.
             super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (Sinks::sinks.
        super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        Sinks::sinks.
        super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pfVar3 = Sinks::sinks.
               super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(long *)(pfVar3 + 0x10) != 0) {
          local_50 = local_70._M_string_length;
          local_48 = _Var2._M_p;
          (**(code **)(pfVar3 + 0x18))(pfVar3,&local_50);
        }
        pfVar3 = pfVar3 + 0x20;
      } while (pfVar3 != pfVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void info(string_view fmt, Ts&&... ts) { if (is(Info)) log(Info, fmt, std::forward<Ts>(ts)...); }